

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int xmlXPathRunStreamEval
              (xmlXPathContextPtr ctxt,xmlPatternPtr comp,xmlXPathObjectPtr *resultSeq,int toBool)

{
  xmlElementType xVar1;
  xmlGenericErrorFunc p_Var2;
  uint uVar3;
  bool bVar4;
  xmlDocPtr pxVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  xmlXPathObjectPtr pxVar9;
  xmlStreamCtxtPtr streamCtxt;
  xmlDocPtr val;
  xmlDocPtr val_00;
  xmlGenericErrorFunc *pp_Var10;
  void **ppvVar11;
  int iVar12;
  xmlDocPtr pxVar13;
  xmlChar *ns;
  int iVar14;
  int iVar15;
  
  if (comp == (xmlPatternPtr)0x0 || ctxt == (xmlXPathContextPtr)0x0) {
    return -1;
  }
  iVar6 = xmlPatternMaxDepth(comp);
  if (iVar6 == -1) {
    return -1;
  }
  iVar12 = 10000;
  if (iVar6 != -2) {
    iVar12 = iVar6;
  }
  iVar6 = xmlPatternMinDepth(comp);
  if (iVar6 == -1) {
    return -1;
  }
  iVar7 = xmlPatternFromRoot(comp);
  if (iVar7 < 0) {
    return -1;
  }
  if (toBool == 0) {
    if (resultSeq == (xmlXPathObjectPtr *)0x0) {
      return -1;
    }
    pxVar9 = xmlXPathCacheNewNodeSet(ctxt,(xmlNodePtr)0x0);
    *resultSeq = pxVar9;
    if (pxVar9 == (xmlXPathObjectPtr)0x0) {
      return -1;
    }
  }
  if (iVar6 == 0) {
    if (iVar7 != 0) {
      if (toBool != 0) {
        return 1;
      }
      xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,(xmlNodePtr)ctxt->doc);
      goto LAB_001e0b28;
    }
    if (toBool != 0) {
      return 1;
    }
    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,ctxt->node);
    if (iVar12 == 0) {
      return 0;
    }
LAB_001e0bd4:
    pxVar13 = (xmlDocPtr)ctxt->node;
    if (pxVar13 == (xmlDocPtr)0x0) {
      return 0;
    }
    uVar8 = pxVar13->type - XML_ELEMENT_NODE;
    uVar3 = uVar8 >> 1;
    if (6 < (uVar3 | (uint)((uVar8 & 1) != 0) << 0x1f)) {
      return 0;
    }
    bVar4 = true;
    val = pxVar13;
    if ((0x71U >> (uVar3 & 0x1f) & 1) == 0) {
      return 0;
    }
  }
  else {
LAB_001e0b28:
    if (iVar12 == 0) {
      return 0;
    }
    if (iVar7 == 0) goto LAB_001e0bd4;
    if (ctxt->doc == (xmlDocPtr)0x0) {
      return 0;
    }
    pxVar13 = (xmlDocPtr)0x0;
    bVar4 = false;
    val = ctxt->doc;
  }
  streamCtxt = xmlPatternGetStreamCtxt(comp);
  if (streamCtxt == (xmlStreamCtxtPtr)0x0) {
    return 0;
  }
  iVar6 = xmlStreamWantsAnyNode(streamCtxt);
  if ((!bVar4) && (iVar7 = xmlStreamPush(streamCtxt,(xmlChar *)0x0,(xmlChar *)0x0), iVar7 == 1)) {
    iVar7 = 1;
    if (toBool != 0) goto LAB_001e0c5f;
    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,(xmlNodePtr)val);
  }
  if (val->type != XML_NAMESPACE_DECL) {
    iVar15 = 0;
LAB_001e0c84:
    val_00 = (xmlDocPtr)val->children;
    if ((((val_00 != (xmlDocPtr)0x0) && (iVar15 < iVar12)) && (val_00->type != XML_ENTITY_DECL)) &&
       (iVar15 = iVar15 + 1, val = val_00, val_00->type != XML_DTD_NODE)) goto LAB_001e0d1d;
    iVar14 = 0;
    iVar7 = 0;
    if (val != pxVar13) {
      do {
        val_00 = (xmlDocPtr)val->next;
        if (val_00 == (xmlDocPtr)0x0) goto LAB_001e0cc4;
        val = val_00;
      } while ((val_00->type == XML_DTD_NODE) || (val_00->type == XML_ENTITY_DECL));
      goto LAB_001e0d29;
    }
    goto LAB_001e0c5f;
  }
LAB_001e0c5d:
  iVar7 = 0;
LAB_001e0c5f:
  xmlFreeStreamCtxt(streamCtxt);
  return iVar7;
LAB_001e0cc4:
  do {
    val = (xmlDocPtr)val->parent;
    iVar7 = iVar14;
    if ((val == (xmlDocPtr)0x0) || (val == pxVar13)) goto LAB_001e0c5f;
    xVar1 = val->type;
    if (xVar1 == XML_ELEMENT_NODE) {
LAB_001e0cfa:
      xmlStreamPop(streamCtxt);
    }
    else {
      if (xVar1 == XML_DOCUMENT_NODE) goto LAB_001e0c5f;
      if (((iVar6 != 0) && (xVar1 < XML_DOCUMENT_NODE)) &&
         ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) != 0)) goto LAB_001e0cfa;
    }
    val_00 = (xmlDocPtr)val->next;
    iVar15 = iVar15 + -1;
  } while (val_00 == (xmlDocPtr)0x0);
LAB_001e0d1d:
  if (-1 < iVar15) {
LAB_001e0d29:
    do {
      if (ctxt->opLimit != 0) {
        if (ctxt->opLimit <= ctxt->opCount) {
          pp_Var10 = __xmlGenericError();
          p_Var2 = *pp_Var10;
          ppvVar11 = __xmlGenericErrorContext();
          (*p_Var2)(*ppvVar11,"XPath operation limit exceeded\n");
          iVar7 = -1;
          goto LAB_001e0c5f;
        }
        ctxt->opCount = ctxt->opCount + 1;
      }
      xVar1 = val_00->type;
      val = val_00;
      if (XML_COMMENT_NODE < xVar1) goto LAB_001e0e1c;
      if ((0x198U >> (xVar1 & (XML_ATTRIBUTE_DECL|XML_ELEMENT_DECL)) & 1) == 0) {
        if (xVar1 != XML_ELEMENT_NODE) goto LAB_001e0e1c;
        if (*(long *)&val_00->compression == 0) {
          ns = (xmlChar *)0x0;
        }
        else {
          ns = *(xmlChar **)(*(long *)&val_00->compression + 0x10);
        }
        iVar7 = xmlStreamPush(streamCtxt,(xmlChar *)val_00->name,ns);
      }
      else {
        if (iVar6 == 0) goto LAB_001e0e1c;
        iVar7 = xmlStreamPushNode(streamCtxt,(xmlChar *)0x0,(xmlChar *)0x0,xVar1);
      }
      if (iVar7 == 1) {
        if (toBool != 0) {
          iVar7 = 1;
          goto LAB_001e0c5f;
        }
        iVar7 = xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,(xmlNodePtr)val_00);
        if (iVar7 < 0) {
          (ctxt->lastError).domain = 0xc;
          (ctxt->lastError).code = 2;
        }
      }
      if ((val_00->children != (_xmlNode *)0x0) && (iVar15 < iVar12)) goto LAB_001e0e1c;
      xmlStreamPop(streamCtxt);
      pxVar5 = (xmlDocPtr)val_00->next;
      while( true ) {
        val_00 = pxVar5;
        if (val_00 == (xmlDocPtr)0x0) goto LAB_001e0e1c;
        if ((val_00->type != XML_ENTITY_DECL) && (val_00->type != XML_DTD_NODE)) break;
        pxVar5 = (xmlDocPtr)val_00->next;
        val = val_00;
      }
    } while( true );
  }
  goto LAB_001e0c5d;
LAB_001e0e1c:
  iVar7 = 0;
  if (val->type == XML_NAMESPACE_DECL) goto LAB_001e0c5f;
  goto LAB_001e0c84;
}

Assistant:

static int
xmlXPathRunStreamEval(xmlXPathContextPtr ctxt, xmlPatternPtr comp,
		      xmlXPathObjectPtr *resultSeq, int toBool)
{
    int max_depth, min_depth;
    int from_root;
    int ret, depth;
    int eval_all_nodes;
    xmlNodePtr cur = NULL, limit = NULL;
    xmlStreamCtxtPtr patstream = NULL;

    if ((ctxt == NULL) || (comp == NULL))
        return(-1);
    max_depth = xmlPatternMaxDepth(comp);
    if (max_depth == -1)
        return(-1);
    if (max_depth == -2)
        max_depth = 10000;
    min_depth = xmlPatternMinDepth(comp);
    if (min_depth == -1)
        return(-1);
    from_root = xmlPatternFromRoot(comp);
    if (from_root < 0)
        return(-1);
#if 0
    printf("stream eval: depth %d from root %d\n", max_depth, from_root);
#endif

    if (! toBool) {
	if (resultSeq == NULL)
	    return(-1);
	*resultSeq = xmlXPathCacheNewNodeSet(ctxt, NULL);
	if (*resultSeq == NULL)
	    return(-1);
    }

    /*
     * handle the special cases of "/" amd "." being matched
     */
    if (min_depth == 0) {
	if (from_root) {
	    /* Select "/" */
	    if (toBool)
		return(1);
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval,
		                     (xmlNodePtr) ctxt->doc);
	} else {
	    /* Select "self::node()" */
	    if (toBool)
		return(1);
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, ctxt->node);
	}
    }
    if (max_depth == 0) {
	return(0);
    }

    if (from_root) {
        cur = (xmlNodePtr)ctxt->doc;
    } else if (ctxt->node != NULL) {
        switch (ctxt->node->type) {
            case XML_ELEMENT_NODE:
            case XML_DOCUMENT_NODE:
            case XML_DOCUMENT_FRAG_NODE:
            case XML_HTML_DOCUMENT_NODE:
	        cur = ctxt->node;
		break;
            case XML_ATTRIBUTE_NODE:
            case XML_TEXT_NODE:
            case XML_CDATA_SECTION_NODE:
            case XML_ENTITY_REF_NODE:
            case XML_ENTITY_NODE:
            case XML_PI_NODE:
            case XML_COMMENT_NODE:
            case XML_NOTATION_NODE:
            case XML_DTD_NODE:
            case XML_DOCUMENT_TYPE_NODE:
            case XML_ELEMENT_DECL:
            case XML_ATTRIBUTE_DECL:
            case XML_ENTITY_DECL:
            case XML_NAMESPACE_DECL:
            case XML_XINCLUDE_START:
            case XML_XINCLUDE_END:
		break;
	}
	limit = cur;
    }
    if (cur == NULL) {
        return(0);
    }

    patstream = xmlPatternGetStreamCtxt(comp);
    if (patstream == NULL) {
	/*
	* QUESTION TODO: Is this an error?
	*/
	return(0);
    }

    eval_all_nodes = xmlStreamWantsAnyNode(patstream);

    if (from_root) {
	ret = xmlStreamPush(patstream, NULL, NULL);
	if (ret < 0) {
	} else if (ret == 1) {
	    if (toBool)
		goto return_1;
            /* TODO: Check memory error. */
	    xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, cur);
	}
    }
    depth = 0;
    goto scan_children;
next_node:
    do {
        if (ctxt->opLimit != 0) {
            if (ctxt->opCount >= ctxt->opLimit) {
                xmlGenericError(xmlGenericErrorContext,
                        "XPath operation limit exceeded\n");
                xmlFreeStreamCtxt(patstream);
                return(-1);
            }
            ctxt->opCount++;
        }

	switch (cur->type) {
	    case XML_ELEMENT_NODE:
	    case XML_TEXT_NODE:
	    case XML_CDATA_SECTION_NODE:
	    case XML_COMMENT_NODE:
	    case XML_PI_NODE:
		if (cur->type == XML_ELEMENT_NODE) {
		    ret = xmlStreamPush(patstream, cur->name,
				(cur->ns ? cur->ns->href : NULL));
		} else if (eval_all_nodes)
		    ret = xmlStreamPushNode(patstream, NULL, NULL, cur->type);
		else
		    break;

		if (ret < 0) {
		    /* NOP. */
		} else if (ret == 1) {
		    if (toBool)
			goto return_1;
		    if (xmlXPathNodeSetAddUnique((*resultSeq)->nodesetval, cur)
		        < 0) {
			ctxt->lastError.domain = XML_FROM_XPATH;
			ctxt->lastError.code = XML_ERR_NO_MEMORY;
		    }
		}
		if ((cur->children == NULL) || (depth >= max_depth)) {
		    ret = xmlStreamPop(patstream);
		    while (cur->next != NULL) {
			cur = cur->next;
			if ((cur->type != XML_ENTITY_DECL) &&
			    (cur->type != XML_DTD_NODE))
			    goto next_node;
		    }
		}
	    default:
		break;
	}

scan_children:
	if (cur->type == XML_NAMESPACE_DECL) break;
	if ((cur->children != NULL) && (depth < max_depth)) {
	    /*
	     * Do not descend on entities declarations
	     */
	    if (cur->children->type != XML_ENTITY_DECL) {
		cur = cur->children;
		depth++;
		/*
		 * Skip DTDs
		 */
		if (cur->type != XML_DTD_NODE)
		    continue;
	    }
	}

	if (cur == limit)
	    break;

	while (cur->next != NULL) {
	    cur = cur->next;
	    if ((cur->type != XML_ENTITY_DECL) &&
		(cur->type != XML_DTD_NODE))
		goto next_node;
	}

	do {
	    cur = cur->parent;
	    depth--;
	    if ((cur == NULL) || (cur == limit) ||
                (cur->type == XML_DOCUMENT_NODE))
	        goto done;
	    if (cur->type == XML_ELEMENT_NODE) {
		ret = xmlStreamPop(patstream);
	    } else if ((eval_all_nodes) &&
		((cur->type == XML_TEXT_NODE) ||
		 (cur->type == XML_CDATA_SECTION_NODE) ||
		 (cur->type == XML_COMMENT_NODE) ||
		 (cur->type == XML_PI_NODE)))
	    {
		ret = xmlStreamPop(patstream);
	    }
	    if (cur->next != NULL) {
		cur = cur->next;
		break;
	    }
	} while (cur != NULL);

    } while ((cur != NULL) && (depth >= 0));

done:

    if (patstream)
	xmlFreeStreamCtxt(patstream);
    return(0);

return_1:
    if (patstream)
	xmlFreeStreamCtxt(patstream);
    return(1);
}